

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O1

void __thiscall
MlNeuron::MlNeuron(MlNeuron *this,Time *time,double v_0,double theta,double spikeheight,double tau,
                  double v_rest,string *name,string *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  VoltageDependance *this_00;
  StochasticVariable *pSVar4;
  MlCalciumChannel *this_01;
  MlPotassiumChannel *this_02;
  undefined1 local_2d0 [104];
  DifferentialEquation *local_268;
  Parametric *local_260;
  string local_258;
  string local_238;
  DifferentialEquation *local_218;
  undefined1 local_210 [104];
  double local_1a8;
  double local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  Unit local_98;
  
  pcVar3 = (name->_M_dataplus)._M_p;
  local_218 = (DifferentialEquation *)v_0;
  local_1a8 = tau;
  local_1a0 = v_rest;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + name->_M_string_length);
  pcVar3 = (type->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + type->_M_string_length);
  SpikingNeuron::SpikingNeuron(&this->super_SpikingNeuron,time,&local_b8,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (this->super_SpikingNeuron).super_Neuron._vptr_Neuron = (_func_int **)&PTR_addStimulus_0015db38;
  local_260 = (Parametric *)&(this->super_SpikingNeuron).super_StochasticEventGenerator;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Parametric._vptr_Parametric = (_func_int **)&PTR__MlNeuron_0015db80;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__MlNeuron_0015dc18;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.super_Physical._vptr_Physical = (_func_int **)&PTR__MlNeuron_0015dc60;
  pcVar3 = local_2d0 + 0x10;
  local_2d0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"V","");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Differential Equation","");
  local_268 = &this->mlneuronMembrane;
  DifferentialEquation::DifferentialEquation
            (local_268,time,(double)local_218,0.0,(string *)local_2d0,(string *)local_210);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((pointer)local_2d0._0_8_ != pcVar3) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  local_2d0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Differential Equation","");
  local_218 = &this->mlneuronRelaxation;
  DifferentialEquation::DifferentialEquation(local_218,(string *)local_2d0,(string *)local_210);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((pointer)local_2d0._0_8_ != pcVar3) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  local_2d0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"threshold","");
  Parametric::addParameter(local_260,(string *)local_2d0);
  if ((pointer)local_2d0._0_8_ != pcVar3) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  local_2d0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"spike-height","");
  Parametric::addParameter(local_260,(string *)local_2d0);
  if ((pointer)local_2d0._0_8_ != pcVar3) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  local_2d0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"membrane","");
  Parametric::addParameter(local_260,(string *)local_2d0);
  if ((pointer)local_2d0._0_8_ != pcVar3) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_Physical.
                     physicalDescription,0,
             (char *)(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_Physical.
                     physicalDescription._M_string_length,0x14d87f);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.stochDescription,0,
             (char *)(this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.stochDescription.
                     _M_string_length,0x14db3f);
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventCurrentValue = false;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
  this->mlneuronTheta = theta;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"m","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"V","");
  Unit::Unit((Unit *)local_2d0,&local_f8,&local_118);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"F","");
  Unit::Unit((Unit *)local_210,&local_138,&local_158);
  operator*(&local_98,(Unit *)local_2d0,(Unit *)local_210);
  Physical::setUnit(&(this->mlneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                     super_Physical,&local_98);
  Unit::~Unit(&local_98);
  Unit::~Unit((Unit *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  Unit::~Unit((Unit *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"m","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"V","");
  Unit::Unit((Unit *)local_2d0,&local_178,&local_198);
  Unit::operator=(&(this->super_SpikingNeuron).super_StochasticEventGenerator.
                   super_StochasticVariable.super_StochasticProcess.super_Physical.physicalUnit,
                  (Unit *)local_2d0);
  Unit::~Unit((Unit *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  this_00 = (VoltageDependance *)operator_new(0x160);
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"leak","");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Weighted Difference","");
  VoltageDependance::VoltageDependance
            (this_00,1.0 / local_1a8,local_1a0,(string *)local_2d0,(string *)local_210);
  pSVar4 = (StochasticVariable *)operator_new(0x148);
  paVar1 = &local_238.field_2;
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"t","");
  paVar2 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Time Process","");
  TimeProcess::TimeProcess((TimeProcess *)pSVar4,time,&local_238,&local_258);
  DifferentialEquation::addTerm(local_268,(StochasticFunction *)this_00,pSVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  this_01 = (MlCalciumChannel *)operator_new(0x168);
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Calcium Channel","");
  MlCalciumChannel::MlCalciumChannel(this_01,0.0,0.0,(string *)local_2d0,(string *)local_210);
  pSVar4 = (StochasticVariable *)operator_new(0x148);
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"t","");
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Time Process","");
  TimeProcess::TimeProcess((TimeProcess *)pSVar4,time,&local_238,&local_258);
  DifferentialEquation::addTerm(local_268,(StochasticFunction *)this_01,pSVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  this_02 = (MlPotassiumChannel *)operator_new(0x308);
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  local_210._0_8_ = local_210 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Potassium Channel","");
  MlPotassiumChannel::MlPotassiumChannel(this_02,0.0,0.0,(string *)local_2d0,(string *)local_210);
  pSVar4 = (StochasticVariable *)operator_new(0x148);
  local_238._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"t","");
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Time Process","");
  TimeProcess::TimeProcess((TimeProcess *)pSVar4,time,&local_238,&local_258);
  DifferentialEquation::addTerm(local_268,(StochasticFunction *)this_02,pSVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar1) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  return;
}

Assistant:

MlNeuron::MlNeuron(Time *time, double v_0, double theta, double spikeheight, double tau, double v_rest, const string& name, const string& type)
	: SpikingNeuron(time, name, type), mlneuronMembrane(time, v_0, 0.0, "V")
{
	// parameter accessors
	addParameter("threshold");
	addParameter("spike-height");
	addParameter("membrane");
	
	// write descriptions
	physicalDescription = "voltage";
	stochDescription = "LIF Neuron membrane";
	
	// assign values
	eventCurrentValue = false;
	eventNextValue = false;
	mlneuronTheta = theta;	
	mlneuronMembrane.setUnit( Unit("m","V") * Unit("u","F") );
	physicalUnit = Unit("m","V");
	
	// add decay terms
	mlneuronMembrane.addTerm( new VoltageDependance(1.0/tau, v_rest, "leak"), new TimeProcess(time) );
	mlneuronMembrane.addTerm( new MlCalciumChannel(0.0, 0.0, ""), new TimeProcess(time) );
	mlneuronMembrane.addTerm( new MlPotassiumChannel(0.0, 0.0, ""), new TimeProcess(time) );
}